

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

int searcher_Croot(lua_State *L)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  char *in_RCX;
  
  iVar1 = 0;
  __s = luaL_checklstring(L,1,(size_t *)0x0);
  pcVar2 = strchr(__s,0x2e);
  if (pcVar2 != (char *)0x0) {
    lua_pushlstring(L,__s,(long)pcVar2 - (long)__s);
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar2 = findfile(L,pcVar2,"cpath",in_RCX);
    if (pcVar2 != (char *)0x0) {
      iVar1 = loadfunc(L,pcVar2,__s);
      if (iVar1 == 0) {
        lua_pushstring(L,pcVar2);
        return 2;
      }
      if (iVar1 != 2) {
        iVar1 = checkload(L,0,pcVar2);
        return iVar1;
      }
      lua_pushfstring(L,"\n\tno module \'%s\' in file \'%s\'",__s,pcVar2);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int searcher_Croot(lua_State *L) {
    const char *filename;
    const char *name = luaL_checkstring(L, 1);
    const char *p = strchr(name, '.');
    int stat;
    if (p == NULL) return 0;  /* is root */
    lua_pushlstring(L, name, p - name);
    filename = findfile(L, lua_tostring(L, -1), "cpath", LUA_CSUBSEP);
    if (filename == NULL) return 1;  /* root not found */
    if ((stat = loadfunc(L, filename, name)) != 0) {
        if (stat != ERRFUNC)
            return checkload(L, 0, filename);  /* real error */
        else {  /* open function not found */
            lua_pushfstring(L, "\n\tno module '%s' in file '%s'", name, filename);
            return 1;
        }
    }
    lua_pushstring(L, filename);  /* will be 2nd argument to module */
    return 2;
}